

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>
::dx(FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>
     *this,int i)

{
  value_type vVar1;
  value_type vVar2;
  
  vVar1 = FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>::dx
                    (&this->left_->fadexpr_,i);
  vVar2 = FadBinaryMul<FadCst<double>,_Fad<double>_>::dx(&this->right_->fadexpr_,i);
  return vVar2 + vVar1;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) + right_.dx(i);}